

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O0

void __thiscall Simulator::call(Simulator *this,PCode *code)

{
  string *__k;
  int local_e8;
  bool local_e1;
  int local_e0 [5];
  allocator local_c9;
  string local_c8;
  Symbol local_a8;
  mapped_type *local_20;
  pair<int,_int> *func_pos;
  PCode *code_local;
  Simulator *this_local;
  
  func_pos = (pair<int,_int> *)code;
  code_local = (PCode *)this;
  __k = PCode::first_abi_cxx11_(code);
  local_20 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>_>
             ::operator[](&this->func_table_,__k);
  ScopeTree::push(&this->tree_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"__ret__",&local_c9);
  local_e0[0] = eip(this);
  local_e0[0] = local_e0[0] + 1;
  local_e1 = true;
  Symbol::Symbol(&local_a8,&local_c8,local_e0,&local_e1);
  ScopeTree::define(&this->tree_,&local_a8);
  Symbol::~Symbol(&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  local_e8 = local_20->first + 1;
  set_eip(this,&local_e8);
  return;
}

Assistant:

void Simulator::call(const PCode &code) {
    const std::pair<int, int> &func_pos = func_table_[code.first()];
    tree_.push();
    tree_.define(Symbol("__ret__", eip() + 1, true));
    set_eip(func_pos.first + 1);
}